

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestBranch::Run(TestBranch *this)

{
  Outputter **__u;
  bool bVar1;
  bool bVar2;
  int iVar3;
  pointer outputter;
  reference pvVar4;
  long lVar5;
  bool local_16e9;
  string local_16c0 [39];
  allocator local_1699;
  RunParams local_1698;
  undefined1 local_1680 [8];
  Results rs;
  string local_1660 [32];
  undefined1 local_1640 [8];
  TestBranchInternal myTestA;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> local_15f8;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> op;
  ostringstream local_15e0 [8];
  ostringstream oss;
  undefined1 local_1468 [8];
  TestRegistry r;
  TestBranch *this_local;
  
  r._5192_8_ = this;
  testinator::TestRegistry::TestRegistry((TestRegistry *)local_1468);
  std::__cxx11::ostringstream::ostringstream(local_15e0);
  std::make_unique<testinator::DefaultOutputter,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &myTestA.super_Test.m_op);
  __u = &myTestA.super_Test.m_op;
  std::unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>>::
  unique_ptr<testinator::DefaultOutputter,std::default_delete<testinator::DefaultOutputter>,void>
            ((unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>> *)
             &local_15f8,
             (unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
              *)__u);
  std::unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
  ::~unique_ptr((unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
                 *)__u);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1660,"A",
             (allocator *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  TestBranchInternal::TestBranchInternal
            ((TestBranchInternal *)local_1640,(TestRegistry *)local_1468,(string *)local_1660);
  std::__cxx11::string::~string(local_1660);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1698.m_flags = 0;
  local_1698._4_4_ = 0;
  local_1698.m_numPropertyChecks = 0;
  local_1698.m_randomSeed = 0;
  testinator::RunParams::RunParams(&local_1698);
  outputter = std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::
              get(&local_15f8);
  testinator::TestRegistry::RunAllTests
            ((Results *)local_1680,(TestRegistry *)local_1468,&local_1698,outputter);
  if ((Run()::expected_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Run()::expected_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)Run()::expected_abi_cxx11_,"no branch\nbranch A\nno branch\nbranch B",
               &local_1699);
    std::allocator<char>::~allocator((allocator<char> *)&local_1699);
    __cxa_atexit(std::__cxx11::string::~string,Run()::expected_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&Run()::expected_abi_cxx11_);
  }
  bVar2 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::empty
                    ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_1680);
  bVar1 = false;
  local_16e9 = false;
  if (!bVar2) {
    pvVar4 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::front
                       ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)
                        local_1680);
    local_16e9 = false;
    if ((pvVar4->m_success & 1U) != 0) {
      std::__cxx11::ostringstream::str();
      bVar1 = true;
      lVar5 = std::__cxx11::string::find(local_16c0,0x2c6ad0);
      local_16e9 = lVar5 != -1;
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string(local_16c0);
  }
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_1680);
  TestBranchInternal::~TestBranchInternal((TestBranchInternal *)local_1640);
  std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::~unique_ptr
            (&local_15f8);
  std::__cxx11::ostringstream::~ostringstream(local_15e0);
  testinator::TestRegistry::~TestRegistry((TestRegistry *)local_1468);
  return local_16e9;
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss);

    TestBranchInternal myTestA(r, "A");
    testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());

    static string expected =
      "no branch\nbranch A\nno branch\nbranch B";
    return !rs.empty() && rs.front().m_success
      && oss.str().find(expected) != string::npos;
  }